

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

bool __thiscall
docopt::Optional::match
          (Optional *this,PatternList *left,
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *collected)

{
  bool bVar1;
  PatternList *this_00;
  __shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar2;
  shared_ptr<docopt::Pattern> *pattern;
  const_iterator __end2;
  const_iterator __begin2;
  PatternList *__range2;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  *collected_local;
  PatternList *left_local;
  Optional *this_local;
  
  this_00 = &(this->super_BranchPattern).fChildren;
  __end2 = std::
           vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ::begin(this_00);
  pattern = (shared_ptr<docopt::Pattern> *)
            std::
            vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                                *)&pattern);
    if (!bVar1) break;
    this_01 = (__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
              ::operator*(&__end2);
    peVar2 = std::__shared_ptr_access<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    (*peVar2->_vptr_Pattern[2])(peVar2,left,collected);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool match(PatternList& left, std::vector<std::shared_ptr<LeafPattern>>& collected) const override {
			for(auto const& pattern : fChildren) {
				pattern->match(left, collected);
			}
			return true;
		}